

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

BuiltinVariable *
deserializeBuiltinVar(BuiltinVariable *__return_storage_ptr__,QDataStream *stream,int version)

{
  pointer piVar1;
  long lVar2;
  int i;
  long lVar3;
  long in_FS_OFFSET;
  int count;
  int t;
  int local_40;
  BuiltinType local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->arrayDims).d.size = 0;
  (__return_storage_ptr__->arrayDims).d.d = (Data *)0x0;
  (__return_storage_ptr__->arrayDims).d.ptr = (int *)0x0;
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&local_3c);
  __return_storage_ptr__->type = local_3c;
  if (8 < version) {
    QDataStream::operator>>(stream,(int *)&local_3c);
    __return_storage_ptr__->varType = local_3c;
    local_40 = -0x55555556;
    QDataStream::operator>>(stream,&local_40);
    QList<int>::resize(&__return_storage_ptr__->arrayDims,(long)local_40);
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < local_40; lVar3 = lVar3 + 1) {
      piVar1 = QList<int>::data(&__return_storage_ptr__->arrayDims);
      QDataStream::operator>>(stream,(int *)((long)piVar1 + lVar2));
      lVar2 = lVar2 + 4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QShaderDescription::BuiltinVariable deserializeBuiltinVar(QDataStream *stream, int version)
{
    QShaderDescription::BuiltinVariable var;
    int t;
    (*stream) >> t;
    var.type = QShaderDescription::BuiltinType(t);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) >> t;
        var.varType = QShaderDescription::VariableType(t);
        int count;
        (*stream) >> count;
        var.arrayDims.resize(count);
        for (int i = 0; i < count; ++i)
            (*stream) >> var.arrayDims[i];
    }
    return var;
}